

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

vec3 * __thiscall Sphere::intersect(Sphere *this,shared_ptr<Ray> *ray)

{
  float fVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  vec4 left;
  vec4 left_00;
  vec4 right;
  vec4 *pvVar6;
  vec3 *pvVar7;
  float fVar8;
  float fVar9;
  tvec4<float,_(glm::precision)0> left_01;
  vec4 direction;
  vec4 origin;
  
  pvVar6 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  origin.field_0._0_8_ = *(undefined8 *)&pvVar6->field_0;
  origin.field_0._8_8_ = *(undefined8 *)((long)&pvVar6->field_0 + 8);
  pvVar6 = Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  direction.field_0._0_8_ = *(undefined8 *)&pvVar6->field_0;
  direction.field_0._8_8_ = *(undefined8 *)((long)&pvVar6->field_0 + 8);
  glm::detail::compute_normalize<float,_(glm::precision)0,_glm::tvec4,_false>::call(&direction);
  left_01 = glm::operator-(&origin,&(this->super_Obj).position);
  dVar3 = Obj::dot((vec4)left_01.field_0,(vec4)left_01.field_0);
  left.field_0._8_8_ = direction.field_0._8_8_;
  left.field_0._0_8_ = direction.field_0._0_8_;
  dVar4 = Obj::dot(left,(vec4)left_01.field_0);
  fVar8 = (float)(dVar4 + dVar4);
  dVar4 = this->radius;
  right.field_0._8_8_ = direction.field_0._8_8_;
  right.field_0._0_8_ = direction.field_0._0_8_;
  left_00.field_0._8_8_ = direction.field_0._8_8_;
  left_00.field_0._0_8_ = direction.field_0._0_8_;
  dVar5 = Obj::dot(left_00,right);
  fVar9 = fVar8 * fVar8 + (float)dVar5 * -4.0 * (float)((double)(float)dVar3 - dVar4 * dVar4);
  if (0.0 <= fVar9) {
    fVar9 = ((fVar9 + fVar8) * -0.5) / (float)dVar5;
    pvVar6 = Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    uVar2 = *(undefined8 *)&pvVar6->field_0;
    fVar8 = (pvVar6->field_0).field_0.z;
    pvVar6 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (0.0 < fVar9) {
      fVar1 = (pvVar6->field_0).field_0.z;
      pvVar7 = (vec3 *)operator_new(0xc);
      *(ulong *)&pvVar7->field_0 =
           CONCAT44(fVar9 * (float)((ulong)uVar2 >> 0x20) +
                    (float)((ulong)*(undefined8 *)&pvVar6->field_0 >> 0x20),
                    fVar9 * (float)uVar2 + (float)*(undefined8 *)&pvVar6->field_0);
      (pvVar7->field_0).field_0.z = fVar8 * fVar9 + fVar1;
      return pvVar7;
    }
  }
  return (vec3 *)0x0;
}

Assistant:

glm::vec3* Sphere::intersect(std::shared_ptr<Ray> ray) {

    glm::vec4 origin = ray->getOrigin();
    glm::vec4 direction = ray->getDirection();

    glm::normalize(direction);
    glm::vec4 op = origin - position;
    float dotOp = dot(op,op);


    float b = 2.f * (dot(direction, op));
    float c = dotOp - radius * radius;

    float a = dot(direction, direction);

    float discriminant = b * b - 4  *  a * c ;
    if(discriminant < 0){
        return nullptr;
        }

    double t = (-0.5f) * (b + discriminant) / a;

    glm::vec3 d = glm::vec3 (ray->getDirection());
    glm::vec3 o= glm::vec3 (ray->getOrigin());
    if (t > 0.0f) {
        glm::vec3* hitpoint =  new glm::vec3(o.x + d.x * t, o.y + d.y * t, o.z + d.z * t);
        return hitpoint;
    }
    else
    return nullptr;

}